

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O3

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint32_t Width;
  uint32_t uVar2;
  uint uVar3;
  uint32_t Height;
  uint uVar4;
  ulong uVar5;
  GMM_GFX_SIZE_T GVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t local_64;
  GMM_PLATFORM_INFO *pGStack_60;
  uint32_t CompressDepth;
  uint local_54;
  uint local_50;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t local_44;
  ulong local_40;
  uint8_t local_31;
  
  pGStack_60 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  uVar2 = (pTexInfo->Alignment).HAlign;
  CompressHeight = (pTexInfo->Alignment).VAlign;
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  Height = pTexInfo->BaseHeight;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_50,&local_54,&local_64);
  CompressWidth = MipLevel;
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
     (CompressWidth = (pTexInfo->Alignment).MipTailStartLod, MipLevel <= CompressWidth)) {
    CompressWidth = MipLevel;
  }
  local_44 = MipLevel;
  if (CompressWidth < 2) {
    uVar5 = 0;
    iVar8 = 0;
    if (CompressWidth == 0) goto LAB_001a64dd;
  }
  else {
    local_40 = CONCAT44(local_40._4_4_,uVar2);
    uVar2 = 1;
    Width = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,pTexInfo,1);
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar2 = (pTexInfo->MSAA).NumSamples;
    }
    uVar7 = pTexInfo->BitsPerPixel;
    uVar4 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,Width,(uint32_t)local_40,uVar2);
    if (local_31 == '\0') {
      aVar1 = (pTexInfo->Flags).Gpu;
      if ((aVar1._0_4_ >> 0x1d & 1) == 0) {
        uVar5 = ~(ulong)aVar1 & 0x20000000002;
      }
      else {
        if ((~(ulong)aVar1 & 0x20000000002) != 0) goto LAB_001a6428;
        uVar5 = (ulong)(pTexInfo->Flags).Info & 0x400000000;
      }
      if (uVar5 == 0) {
        uVar2 = pTexInfo->BitsPerPixel;
        uVar7 = 8;
        if (uVar2 == 0x80) {
          uVar4 = uVar4 >> 1;
        }
        else if (uVar2 == 0x40) {
          uVar4 = uVar4 >> 2;
        }
        else if (uVar2 == 0x20) {
          uVar4 = uVar4 >> 3;
        }
      }
    }
    else {
      uVar4 = uVar4 / local_50;
    }
LAB_001a6428:
    uVar5 = (ulong)uVar7 * (ulong)uVar4 >> 3;
  }
  uVar4 = 1;
  iVar8 = 0;
  local_40 = uVar5;
  do {
    uVar2 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar2 = (pTexInfo->MSAA).NumSamples;
    }
    uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,Height,CompressHeight,uVar2);
    if (local_31 == '\0') {
      aVar1 = (pTexInfo->Flags).Gpu;
      if (((aVar1._0_4_ >> 0x1d & 1) == 0) || (((ulong)(pTexInfo->Flags).Info & 0x400000000) == 0))
      {
        uVar3 = uVar2 >> 4;
        if ((~(ulong)aVar1 & 0x20000000002) != 0) {
          uVar3 = uVar2;
        }
      }
      else {
        uVar3 = uVar2 >> 1;
      }
    }
    else {
      uVar3 = uVar2 / local_54;
    }
    if (uVar4 == 2) {
      uVar3 = 0;
    }
    iVar8 = iVar8 + uVar3;
    Height = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar4);
    uVar4 = uVar4 + 1;
    uVar5 = local_40;
  } while (uVar4 <= CompressWidth);
LAB_001a64dd:
  uVar2 = pGStack_60->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
  GVar6 = (uVar2 + (uVar2 == 0)) * iVar8 * (int)pTexInfo->Pitch + uVar5;
  if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) != 0) &&
     ((pTexInfo->Alignment).MipTailStartLod <= local_44)) {
    uVar4 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[9])(this,pTexInfo);
    GVar6 = GVar6 + uVar4;
  }
  return GVar6;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen9TextureCalc::Get2DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    uint32_t       AlignedMipHeight, i, OffsetHeight;
    uint8_t        Compressed;
    uint32_t       HAlign, VAlign, __MipLevel;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;
    uint32_t       MipHeight;
    GMM_GFX_SIZE_T MipOffset;

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    HAlign     = pTexInfo->Alignment.HAlign;
    VAlign     = pTexInfo->Alignment.VAlign;
    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipHeight    = pTexInfo->BaseHeight;
    OffsetHeight = 0;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    __MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;

    if(__MipLevel < 2) // LOD0 and LOD1 are on the left edge...
    {
        MipOffset = 0;
    }
    else // LOD2 and beyond are to the right of LOD1...
    {
        uint32_t MipWidth     = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, 1));
        uint32_t BitsPerPixel = pTexInfo->BitsPerPixel;

        MipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

        if(Compressed)
        {
            MipWidth /= CompressWidth;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
	    //Expt: Stencil Row interleaving, where Rowheight = VALign=8
            //XOffset on interleaved row not different than w/o interleave.
            //MipWidth *= 2;	
	}
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BitsPerPixel = 8; // Aux Surfaces are 8bpp

            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    MipWidth /= 8;
                    break;
                case 64:
                    MipWidth /= 4;
                    break;
                case 128:
                    MipWidth /= 2;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }

        MipOffset = (GMM_GFX_SIZE_T)MipWidth * BitsPerPixel >> 3;
    }

    for(i = 1; i <= __MipLevel; i++)
    {
        AlignedMipHeight = GFX_ULONG_CAST(__GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo));

        if(Compressed)
        {
            AlignedMipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            AlignedMipHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            AlignedMipHeight /= 16;
        }

        OffsetHeight += ((i != 2) ? AlignedMipHeight : 0);

        MipHeight = GmmTexGetMipHeight(pTexInfo, i);
    }
    OffsetHeight *= GFX_MAX(pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth, 1);

    MipOffset += OffsetHeight * GFX_ULONG_CAST(pTexInfo->Pitch);

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       (MipLevel >= pTexInfo->Alignment.MipTailStartLod))
    {
        MipOffset += GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    GMM_DPF_EXIT;
    return (MipOffset);
}